

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFormatUtil.hpp
# Opt level: O3

ostream * tcu::Format::operator<<
                    (ostream *str,
                    Array<const_deqp::gles3::Functional::TransformFeedback::DrawCall_*> *fmt)

{
  DrawCall *call;
  
  std::__ostream_insert<char,std::char_traits<char>>(str,"{ ",2);
  call = fmt->begin;
  if (call != fmt->end) {
    do {
      if (call != fmt->begin) {
        std::__ostream_insert<char,std::char_traits<char>>(str,", ",2);
      }
      deqp::gles3::Functional::TransformFeedback::operator<<(str,call);
      call = call + 1;
    } while (call != fmt->end);
  }
  std::__ostream_insert<char,std::char_traits<char>>(str," }",2);
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const Array<Iterator>& fmt)
{
	str << "{ ";
	for (Iterator cur = fmt.begin; cur != fmt.end; ++cur)
	{
		if (cur != fmt.begin)
			str << ", ";
		str << *cur;
	}
	str << " }";
	return str;
}